

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

TextureCubeArray * __thiscall
tcu::TextureCubeArray::operator=(TextureCubeArray *this,TextureCubeArray *other)

{
  ConstPixelBufferAccess *pCVar1;
  int iVar2;
  
  if (this != other) {
    TextureLevelPyramid::operator=
              (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
    iVar2 = other->m_depth;
    this->m_size = other->m_size;
    this->m_depth = iVar2;
    pCVar1 = &((this->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
    (this->m_view).m_numLevels =
         (int)(((long)(this->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x28);
    (this->m_view).m_levels = pCVar1;
  }
  return this;
}

Assistant:

TextureCubeArray& TextureCubeArray::operator= (const TextureCubeArray& other)
{
	if (this == &other)
		return *this;

	TextureLevelPyramid::operator=(other);

	m_size	= other.m_size;
	m_depth	= other.m_depth;
	m_view	= TextureCubeArrayView(getNumLevels(), getLevels());

	DE_ASSERT(m_depth % 6 == 0);

	return *this;
}